

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O0

void bsc_group_destroy(bsc_group_t group)

{
  group_t *g;
  bsc_group_t group_local;
  
  group_destroy((group_t *)group);
  free(group);
  return;
}

Assistant:

void bsc_group_destroy( bsc_group_t group )
{
    group_t * g = group;
    group_destroy( g );
    free( g );
}